

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::logProgramData
          (InvalidShaderCompilerCase *this,BuildInfo *buildInfo,ProgramContext *progCtx)

{
  TestLog *this_00;
  size_t in_RCX;
  size_t sVar1;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  allocator<char> local_111;
  string local_110 [32];
  LogShader local_f0;
  LogShader local_a0;
  undefined1 local_50 [40];
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>(local_110,"(No linking done)",&local_111);
  local_50[0] = false;
  std::__cxx11::string::string((string *)(local_50 + 8),local_110);
  __fd = (int)this_00;
  tcu::LogShaderProgram::write((LogShaderProgram *)local_50,__fd,__buf,in_RCX);
  sVar1 = (size_t)buildInfo->vertCompileSuccess;
  tcu::LogShader::LogShader
            (&local_a0,QP_SHADER_TYPE_VERTEX,&progCtx->vertShaderSource,
             buildInfo->vertCompileSuccess,&(buildInfo->logs).vert);
  tcu::LogShader::write(&local_a0,__fd,__buf_00,sVar1);
  sVar1 = (size_t)buildInfo->fragCompileSuccess;
  tcu::LogShader::LogShader
            (&local_f0,QP_SHADER_TYPE_FRAGMENT,&progCtx->fragShaderSource,
             buildInfo->fragCompileSuccess,&(buildInfo->logs).frag);
  tcu::LogShader::write(&local_f0,__fd,__buf_01,sVar1);
  tcu::TestLog::endShaderProgram(this_00);
  tcu::LogShader::~LogShader(&local_f0);
  tcu::LogShader::~LogShader(&local_a0);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string(local_110);
  return;
}

Assistant:

void InvalidShaderCompilerCase::logProgramData (const BuildInfo& buildInfo, const ProgramContext& progCtx) const
{
	m_testCtx.getLog() << TestLog::ShaderProgram(false, "(No linking done)")
					   << TestLog::Shader(QP_SHADER_TYPE_VERTEX,	progCtx.vertShaderSource, buildInfo.vertCompileSuccess, buildInfo.logs.vert)
					   << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT,	progCtx.fragShaderSource, buildInfo.fragCompileSuccess, buildInfo.logs.frag)
					   << TestLog::EndShaderProgram;
}